

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanosvg.h
# Opt level: O0

void nsvg__pathLineTo(NSVGparser *p,float *cpx,float *cpy,float *args,int rel)

{
  int rel_local;
  float *args_local;
  float *cpy_local;
  float *cpx_local;
  NSVGparser *p_local;
  
  if (rel == 0) {
    *cpx = *args;
    *cpy = args[1];
  }
  else {
    *cpx = *args + *cpx;
    *cpy = args[1] + *cpy;
  }
  nsvg__lineTo(p,*cpx,*cpy);
  return;
}

Assistant:

static void nsvg__pathLineTo(NSVGparser* p, float* cpx, float* cpy, float* args, int rel)
{
	if (rel) {
		*cpx += args[0];
		*cpy += args[1];
	} else {
		*cpx = args[0];
		*cpy = args[1];
	}
	nsvg__lineTo(p, *cpx, *cpy);
}